

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void NodeEnumSingletonsEx(anynode *Any,array *List,nodemodule *Module)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long *Ptr;
  
  if (Any != (anynode *)0x0) {
    lVar1 = **(long **)((long)Any + 8);
    List->_Begin = (char *)0x0;
    List->_Used = 0;
    uVar2 = *(ulong *)(lVar1 + 0x68);
    if (7 < uVar2) {
      plVar3 = *(long **)(lVar1 + 0x60);
      Ptr = plVar3;
      do {
        if ((*Ptr != 0) &&
           ((Module == (nodemodule *)0x0 ||
            (*(nodemodule **)(*(long *)(*Ptr + 8) + -0x38) == Module)))) {
          ArrayAppend(List,Ptr,8,0x40);
          plVar3 = *(long **)(lVar1 + 0x60);
          uVar2 = *(ulong *)(lVar1 + 0x68);
        }
        Ptr = Ptr + 1;
      } while (Ptr != (long *)((uVar2 & 0xfffffffffffffff8) + (long)plVar3));
    }
    return;
  }
  __assert_fail("(const void*)(Any)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x603,"void NodeEnumSingletonsEx(anynode *, array *, nodemodule *)");
}

Assistant:

static NOINLINE void NodeEnumSingletonsEx(anynode* Any,array* List, nodemodule* Module)
{
    nodecontext* p = Node_Context(Any);
    node** i;
    ArrayInit(List);

    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i && (!Module || NodeGetClass(*i)->Module == Module))
            ArrayAppend(List,i,sizeof(*i),64);
}